

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

Dist * Omega_h::get_local_elem_uses2own_verts(Dist *__return_storage_ptr__,Mesh *mesh)

{
  Int to;
  LO nrroots;
  LOs verts2uses;
  Remotes uses2own_verts;
  Remotes verts2own_verts;
  Adj verts2elems;
  undefined1 auStack_f8 [80];
  Remotes local_a8;
  Remotes local_88;
  Remotes local_68;
  Adj local_48;
  
  to = Mesh::dim(mesh);
  Mesh::ask_up(&local_48,mesh,0,to);
  Write<int>::Write((Write<int> *)(auStack_f8 + 0x20),(Write<int> *)&local_48);
  Mesh::ask_owners(&local_68,mesh,0);
  Remotes::Remotes(&local_a8,&local_68);
  Write<int>::Write((Write<int> *)(auStack_f8 + 0x10),(Write<int> *)(auStack_f8 + 0x20));
  expand(&local_88,&local_a8,(LOs *)(auStack_f8 + 0x10));
  Write<int>::~Write((Write<int> *)(auStack_f8 + 0x10));
  Remotes::~Remotes(&local_a8);
  Mesh::comm((Mesh *)auStack_f8);
  Remotes::Remotes((Remotes *)(auStack_f8 + 0x30),&local_88);
  nrroots = Mesh::nverts(mesh);
  Dist::Dist(__return_storage_ptr__,(CommPtr *)auStack_f8,(Remotes *)(auStack_f8 + 0x30),nrroots);
  Remotes::~Remotes((Remotes *)(auStack_f8 + 0x30));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_f8 + 8));
  Remotes::~Remotes(&local_88);
  Remotes::~Remotes(&local_68);
  Write<int>::~Write((Write<int> *)(auStack_f8 + 0x20));
  Adj::~Adj(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Dist get_local_elem_uses2own_verts(Mesh* mesh) {
  auto verts2elems = mesh->ask_up(VERT, mesh->dim());
  auto verts2uses = verts2elems.a2ab;
  auto verts2own_verts = mesh->ask_owners(VERT);
  auto uses2own_verts = expand(verts2own_verts, verts2uses);
  return Dist(mesh->comm(), uses2own_verts, mesh->nverts());
}